

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bc7decomp.cpp
# Opt level: O1

bool bc7decomp::unpack_bc7_mode4_5(uint32_t mode,void *pBlock_bits,color_rgba *pPixels)

{
  uint8_t uVar1;
  uint uVar2;
  anon_union_4_2_6eba8969_for_color_rgba_0 aVar3;
  byte *pbVar4;
  uint uVar5;
  long lVar6;
  uint32_t total_bits;
  uint uVar7;
  long lVar8;
  undefined4 *puVar9;
  int iVar10;
  uint32_t c_2;
  int iVar11;
  uint uVar12;
  uint32_t bits_1;
  uint uVar13;
  anon_union_4_2_6eba8969_for_color_rgba_0 *paVar14;
  uint32_t i;
  uint32_t bits;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  uint32_t weights [16];
  uint local_100;
  byte local_fc [4];
  byte abStack_f8 [8];
  uint local_f0;
  uint local_ec;
  int local_e8 [2];
  color_rgba *local_e0;
  uint8_t local_d8 [32];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_b8 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_78;
  color_rgba endpoints [2];
  uint32_t weight_bits [2];
  color_rgba block_colors [8];
  
  bVar18 = mode != 4;
  uVar2 = 0;
  local_ec = 0;
  uVar15 = mode + 1;
  if (uVar15 != 0) {
    local_ec = 0;
    uVar7 = 0;
    uVar2 = 0;
    do {
      iVar10 = 8 - (uVar2 & 7);
      if ((int)(uVar15 - uVar7) <= iVar10) {
        iVar10 = uVar15 - uVar7;
      }
      local_ec = local_ec |
                 (~(-1 << ((byte)iVar10 & 0x1f)) &
                 (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar2 >> 3)) >> (sbyte)(uVar2 & 7)))
                 << ((byte)uVar7 & 0x1f);
      uVar7 = uVar7 + iVar10;
      uVar2 = uVar2 + iVar10;
    } while (uVar7 < uVar15);
  }
  local_f0 = 1 << ((byte)mode & 0x1f);
  if (local_ec == local_f0) {
    uVar15 = mode == 4 | 2;
    uVar12 = (uint)bVar18 * 2 + 5;
    uVar17 = (uint)bVar18 * 2 + 6;
    uVar16 = 0;
    uVar7 = 0;
    do {
      iVar10 = 8 - (uVar2 & 7);
      if ((int)(2 - uVar7) <= iVar10) {
        iVar10 = 2 - uVar7;
      }
      uVar16 = uVar16 | (~(-1 << ((byte)iVar10 & 0x1f)) &
                        (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar2 >> 3)) >>
                              (sbyte)(uVar2 & 7))) << ((byte)uVar7 & 0x1f);
      uVar7 = uVar7 + iVar10;
      uVar2 = iVar10 + uVar2;
    } while (uVar7 < 2);
    local_100 = 0;
    local_e0 = pPixels;
    uVar7 = uVar2;
    if (mode == 4) {
      uVar7 = uVar2 + 1;
      local_100 = (uint)((*(byte *)((long)pBlock_bits + (ulong)(uVar2 >> 3)) >> (uVar2 & 7) & 1) !=
                        0);
    }
    lVar8 = 0;
    do {
      uVar2 = uVar12;
      if (lVar8 == 3) {
        uVar2 = uVar17;
      }
      lVar6 = 0;
      do {
        uVar13 = 0;
        uVar5 = 0;
        do {
          iVar10 = 8 - (uVar7 & 7);
          if ((int)(uVar2 - uVar5) <= iVar10) {
            iVar10 = uVar2 - uVar5;
          }
          uVar13 = uVar13 | (~(-1 << ((byte)iVar10 & 0x1f)) &
                            (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar7 >> 3)) >>
                                  (sbyte)(uVar7 & 7))) << ((byte)uVar5 & 0x1f);
          uVar5 = uVar5 + iVar10;
          uVar7 = iVar10 + uVar7;
        } while (uVar5 < uVar2);
        local_fc[lVar6 * 4 + lVar8] = (byte)uVar13;
        bVar18 = lVar6 == 0;
        lVar6 = lVar6 + 1;
      } while (bVar18);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    uVar2 = 2;
    if (local_100 == 0) {
      uVar2 = uVar15;
      uVar15 = 2;
    }
    local_e8[1] = uVar2;
    iVar10 = local_e8[local_100];
    paVar14 = local_b8;
    if (local_100 == 0) {
      paVar14 = &local_78;
    }
    lVar8 = 0;
    do {
      aVar3 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      uVar5 = iVar10 - (uint)(lVar8 == 0);
      if (uVar5 != 0) {
        uVar13 = 0;
        do {
          iVar11 = 8 - (uVar7 & 7);
          if ((int)(uVar5 - uVar13) <= iVar11) {
            iVar11 = uVar5 - uVar13;
          }
          aVar3.m_comps =
               aVar3.m_comps |
               (~(-1 << ((byte)iVar11 & 0x1f)) &
               (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar7 >> 3)) >> (sbyte)(uVar7 & 7))) <<
               ((byte)uVar13 & 0x1f);
          uVar13 = uVar13 + iVar11;
          uVar7 = uVar7 + iVar11;
        } while (uVar13 < uVar5);
      }
      paVar14[lVar8] = aVar3;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    iVar10 = local_e8[local_100 ^ 1];
    paVar14 = &local_78;
    if (local_100 == 0) {
      paVar14 = local_b8;
    }
    lVar8 = 0;
    do {
      aVar3 = (anon_union_4_2_6eba8969_for_color_rgba_0)0x0;
      uVar5 = iVar10 - (uint)(lVar8 == 0);
      if (uVar5 != 0) {
        uVar13 = 0;
        do {
          iVar11 = 8 - (uVar7 & 7);
          if ((int)(uVar5 - uVar13) <= iVar11) {
            iVar11 = uVar5 - uVar13;
          }
          aVar3.m_comps =
               aVar3.m_comps |
               (~(-1 << ((byte)iVar11 & 0x1f)) &
               (uint)(*(byte *)((long)pBlock_bits + (ulong)(uVar7 >> 3)) >> (sbyte)(uVar7 & 7))) <<
               ((byte)uVar13 & 0x1f);
          uVar13 = uVar13 + iVar11;
          uVar7 = uVar7 + iVar11;
        } while (uVar13 < uVar5);
      }
      paVar14[lVar8] = aVar3;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
    pbVar4 = local_fc;
    lVar8 = 0;
    do {
      lVar6 = 0;
      do {
        uVar7 = uVar12;
        if (lVar6 == 3) {
          uVar7 = uVar17;
        }
        uVar5 = (uint)pbVar4[lVar6] << (8U - (sbyte)uVar7 & 0x1f);
        pbVar4[lVar6] = (byte)(uVar5 >> (sbyte)uVar7) | (byte)uVar5;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 4);
      pbVar4 = pbVar4 + 4;
      bVar18 = lVar8 == 0;
      lVar8 = lVar8 + 1;
    } while (bVar18);
    uVar7 = 0;
    do {
      puVar9 = &g_bc7_weights3;
      if (uVar15 == 2) {
        puVar9 = &g_bc7_weights2;
      }
      iVar10 = puVar9[uVar7];
      lVar8 = 0;
      do {
        local_b8[0].m_comps[lVar8 + (ulong)uVar7 * 4 + -0x20] =
             (uint8_t)((uint)local_fc[lVar8] * (0x40 - iVar10) + (uint)abStack_f8[lVar8] * iVar10 +
                       0x20 >> 6);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 3);
      uVar7 = uVar7 + 1;
    } while (uVar7 >> (sbyte)uVar15 == 0);
    uVar15 = 1;
    do {
      puVar9 = &g_bc7_weights3;
      if (uVar2 == 2) {
        puVar9 = &g_bc7_weights2;
      }
      local_b8[0].m_comps[(ulong)(uVar15 - 1) * 4 + -0x1d] =
           (uint8_t)((0x40 - puVar9[uVar15 - 1]) * (uint)local_fc[3] +
                     puVar9[uVar15 - 1] * (uint)abStack_f8[3] + 0x20 >> 6);
      uVar7 = uVar15 >> (sbyte)uVar2;
      uVar15 = uVar15 + 1;
    } while (uVar7 == 0);
    lVar8 = 0;
    do {
      local_e0[lVar8].field_0 = local_b8[(ulong)(uint)endpoints[lVar8 + -1].field_0 - 8];
      uVar1 = local_b8[0].m_comps[(ulong)(uint)local_b8[lVar8] * 4 + -0x1d];
      local_e0[lVar8].field_0.m_comps[3] = uVar1;
      if (uVar16 != 0) {
        local_e0[lVar8].field_0.m_comps[3] = local_e0[lVar8].field_0.m_comps[uVar16 - 1];
        local_e0[lVar8].field_0.m_comps[uVar16 - 1] = uVar1;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x10);
  }
  return local_ec == local_f0;
}

Assistant:

bool unpack_bc7_mode4_5(uint32_t mode, const void* pBlock_bits, color_rgba* pPixels)
{
	const uint32_t ENDPOINTS = 2;
	const uint32_t COMPS = 4;
	const uint32_t WEIGHT_BITS = 2;
	const uint32_t A_WEIGHT_BITS = (mode == 4) ? 3 : 2;
	const uint32_t ENDPOINT_BITS = (mode == 4) ? 5 : 7;
	const uint32_t A_ENDPOINT_BITS = (mode == 4) ? 6 : 8;
	//const uint32_t WEIGHT_VALS = 1 << WEIGHT_BITS;
	//const uint32_t A_WEIGHT_VALS = 1 << A_WEIGHT_BITS;

	uint32_t bit_offset = 0;
	const uint8_t* pBuf = static_cast<const uint8_t*>(pBlock_bits);

	if (read_bits32(pBuf, bit_offset, mode + 1) != (1U << mode)) return false;

	const uint32_t comp_rot = read_bits32(pBuf, bit_offset, 2);
	const uint32_t index_mode = (mode == 4) ? read_bits32(pBuf, bit_offset, 1) : 0;

	color_rgba endpoints[ENDPOINTS];
	for (uint32_t c = 0; c < COMPS; c++)
		for (uint32_t e = 0; e < ENDPOINTS; e++)
			endpoints[e][c] = (uint8_t)read_bits32(pBuf, bit_offset, (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);
		
	const uint32_t weight_bits[2] = { index_mode ? A_WEIGHT_BITS : WEIGHT_BITS,  index_mode ? WEIGHT_BITS : A_WEIGHT_BITS };
		
	uint32_t weights[16], a_weights[16];
		
	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? a_weights : weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[index_mode] - ((!i) ? 1 : 0));

	for (uint32_t i = 0; i < 16; i++)
		(index_mode ? weights : a_weights)[i] = read_bits32(pBuf, bit_offset, weight_bits[1 - index_mode] - ((!i) ? 1 : 0));

	assert(bit_offset == 128);

	for (uint32_t e = 0; e < ENDPOINTS; e++)
		for (uint32_t c = 0; c < 4; c++)
			endpoints[e][c] = (uint8_t)bc7_dequant(endpoints[e][c], (c == 3) ? A_ENDPOINT_BITS : ENDPOINT_BITS);

	color_rgba block_colors[8];
	for (uint32_t i = 0; i < (1U << weight_bits[0]); i++)
		for (uint32_t c = 0; c < 3; c++)
			block_colors[i][c] = (uint8_t)bc7_interp(endpoints[0][c], endpoints[1][c], i, weight_bits[0]);

	for (uint32_t i = 0; i < (1U << weight_bits[1]); i++)
		block_colors[i][3] = (uint8_t)bc7_interp(endpoints[0][3], endpoints[1][3], i, weight_bits[1]);

	for (uint32_t i = 0; i < 16; i++)
	{
		pPixels[i] = block_colors[weights[i]];
		pPixels[i].a = block_colors[a_weights[i]].a;
		if (comp_rot >= 1)
			std::swap(pPixels[i].a, pPixels[i].m_comps[comp_rot - 1]);
	}

	return true;
}